

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.cpp
# Opt level: O2

void __thiscall L13_3::BankAccount::withdraw(BankAccount *this,double amount)

{
  double *pdVar1;
  
  if (amount < 0.0) {
    std::operator<<((ostream *)&std::cout,"Withdraw failed. negative value(");
  }
  pdVar1 = &(this->super_Account)._balance;
  if (*pdVar1 <= amount && amount != *pdVar1) {
    std::operator<<((ostream *)&std::cout,"Withdraw failed. not enough remaining balance.\n");
  }
  Account::withdraw(&this->super_Account,amount);
  return;
}

Assistant:

void BankAccount::withdraw(double amount) {
        if (amount < 0) {
            cout << "Withdraw failed. negative value(" << amount << ") not allowed.\n";
            return;
        }
        if (amount > get_balance()) {
            cout << "Withdraw failed. not enough remaining balance.\n";
            return;
        }
        //  call ABC method
        Account::withdraw(amount);
    }